

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int print_tmat(char *fn)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  cmd_ln_t *cmdln;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  float fVar8;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat;
  uint local_4c;
  float local_48;
  uint local_44;
  float32 ***local_40;
  long local_38;
  
  cmdln = cmd_ln_get();
  local_38 = cmd_ln_int_r(cmdln,"-norm");
  pcVar6 = " and normalizing.";
  if ((int)local_38 == 0) {
    pcVar6 = ".";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x16c,"Reading %s%s\n",pcVar6,fn);
  iVar1 = s3tmat_read(fn,&local_40,&local_44,&local_4c);
  iVar2 = -1;
  if (iVar1 == 0) {
    printf("tmat %u %u\n",(ulong)local_44,(ulong)local_4c);
    iVar2 = 0;
    if (local_44 != 0) {
      uVar5 = 0;
      do {
        printf("tmat [%u]\n",uVar5 & 0xffffffff);
        if (local_4c != 1) {
          uVar7 = 0;
          do {
            if ((int)local_38 == 0) {
LAB_001032e8:
              local_48 = 1.0;
              uVar3 = local_4c;
            }
            else {
              if (local_4c == 0) {
LAB_001032bf:
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                        ,0x182,"tmat [%u][%u][*] zero\n",uVar5 & 0xffffffff,uVar7 & 0xffffffff);
                goto LAB_001032e8;
              }
              fVar8 = 0.0;
              uVar4 = 0;
              do {
                fVar8 = fVar8 + (float)local_40[uVar5][uVar7][uVar4];
                uVar4 = uVar4 + 1;
              } while (local_4c != uVar4);
              if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_001032bf;
              uVar3 = 1;
              local_48 = fVar8;
            }
            if (uVar3 != 0) {
              uVar4 = 0;
              do {
                if ((float)local_40[uVar5][uVar7][uVar4] <= 0.0) {
                  printf(" %8s","");
                }
                else {
                  printf(e_fmt_ld_sp,(double)((float)local_40[uVar5][uVar7][uVar4] / local_48));
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 < local_4c);
            }
            putchar(10);
            uVar7 = uVar7 + 1;
          } while (uVar7 < local_4c - 1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_44);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
print_tmat(const char *fn)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float32 sum;
    
    E_INFO("Reading %s%s\n",
	   (normalize ? " and normalizing." : "."),
	   fn);
    
    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    printf("tmat %u %u\n", n_tmat, n_state_pm);

    for (i = 0; i < n_tmat; i++) {
	printf("tmat [%u]\n", i);

	for (j = 0; j < n_state_pm-1; j++) {

	    if (normalize) {
		for (k = 0, sum = 0; k < n_state_pm; k++) {
		    sum += tmat[i][j][k];
		}

		if (sum == 0) {
		    E_WARN("tmat [%u][%u][*] zero\n", i, j);
		    sum = 1;
		}

	    }
	    else
		sum = 1;

	    for (k = 0; k < n_state_pm; k++) {
		if (tmat[i][j][k] > 0.0) {
		    printf(e_fmt_ld_sp, tmat[i][j][k]/sum);
		}
		else {
		    printf(" %8s", "");
		}
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}